

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::RepeatedField_Large_Test::~RepeatedField_Large_Test
          (RepeatedField_Large_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(RepeatedField, Large) {
  RepeatedField<int> field;

  for (int i = 0; i < 16; i++) {
    field.Add(i * i);
  }

  EXPECT_FALSE(field.empty());
  EXPECT_EQ(field.size(), 16);

  for (int i = 0; i < 16; i++) {
    EXPECT_EQ(field.Get(i), i * i);
  }

  int expected_usage = 16 * sizeof(int);
  EXPECT_GE(field.SpaceUsedExcludingSelf(), expected_usage);
}